

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_use_ecparams(mbedtls_asn1_buf *params,mbedtls_ecp_group *grp)

{
  int iVar1;
  mbedtls_ecp_group_id local_28;
  undefined4 local_24;
  mbedtls_ecp_group_id grp_id;
  int ret;
  mbedtls_ecp_group *grp_local;
  mbedtls_asn1_buf *params_local;
  
  _grp_id = grp;
  grp_local = (mbedtls_ecp_group *)params;
  if (params->tag == 6) {
    iVar1 = mbedtls_oid_get_ec_grp(params,&local_28);
    if (iVar1 != 0) {
      return -0x3a00;
    }
  }
  else {
    iVar1 = pk_group_id_from_specified(params,&local_28);
    if (iVar1 != 0) {
      return iVar1;
    }
    local_24 = 0;
  }
  if ((_grp_id->id == MBEDTLS_ECP_DP_NONE) || (_grp_id->id == local_28)) {
    params_local._4_4_ = mbedtls_ecp_group_load(_grp_id,local_28);
    if (params_local._4_4_ == 0) {
      params_local._4_4_ = 0;
    }
  }
  else {
    params_local._4_4_ = -0x3d00;
  }
  return params_local._4_4_;
}

Assistant:

static int pk_use_ecparams( const mbedtls_asn1_buf *params, mbedtls_ecp_group *grp )
{
    int ret;
    mbedtls_ecp_group_id grp_id;

    if( params->tag == MBEDTLS_ASN1_OID )
    {
        if( mbedtls_oid_get_ec_grp( params, &grp_id ) != 0 )
            return( MBEDTLS_ERR_PK_UNKNOWN_NAMED_CURVE );
    }
    else
    {
#if defined(MBEDTLS_PK_PARSE_EC_EXTENDED)
        if( ( ret = pk_group_id_from_specified( params, &grp_id ) ) != 0 )
            return( ret );
#else
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );
#endif
    }

    /*
     * grp may already be initilialized; if so, make sure IDs match
     */
    if( grp->id != MBEDTLS_ECP_DP_NONE && grp->id != grp_id )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );

    if( ( ret = mbedtls_ecp_group_load( grp, grp_id ) ) != 0 )
        return( ret );

    return( 0 );
}